

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::getDoubleFromString(string *ustring,size_t *index)

{
  long lVar1;
  char *__nptr;
  long lVar2;
  longdouble in_ST0;
  longdouble in_ST1;
  double dVar3;
  longdouble vld;
  char *retloc;
  size_t *index_local;
  string *ustring_local;
  
  stack0xffffffffffffffd8 = 0;
  retloc = (char *)index;
  index_local = (size_t *)ustring;
  __nptr = (char *)std::__cxx11::string::c_str();
  strtold(__nptr,(char **)((long)&vld + 8));
  lVar1 = stack0xffffffffffffffd8;
  if (stack0xffffffffffffffd8 == 0) {
    retloc[0] = '\0';
    retloc[1] = '\0';
    retloc[2] = '\0';
    retloc[3] = '\0';
    retloc[4] = '\0';
    retloc[5] = '\0';
    retloc[6] = '\0';
    retloc[7] = '\0';
    ustring_local = (string *)0x7ff4000000000000;
  }
  else {
    lVar2 = std::__cxx11::string::c_str();
    *(long *)retloc = lVar1 - lVar2;
    if (*(long *)retloc == 0) {
      ustring_local = (string *)0x7ff4000000000000;
    }
    else {
      dVar3 = std::numeric_limits<double>::max();
      if (in_ST0 <= (longdouble)dVar3) {
        dVar3 = std::numeric_limits<double>::max();
        if ((longdouble)-dVar3 <= in_ST0) {
          std::fabs(-dVar3);
          dVar3 = std::numeric_limits<double>::min();
          if ((longdouble)dVar3 <= in_ST1) {
            ustring_local = (string *)(double)in_ST0;
          }
          else {
            ustring_local = (string *)0x0;
          }
        }
        else {
          ustring_local = (string *)0xfff0000000000000;
        }
      }
      else {
        ustring_local = (string *)0x7ff0000000000000;
      }
    }
  }
  return (double)ustring_local;
}

Assistant:

static double
    getDoubleFromString(const std::string& ustring, size_t* index) noexcept
{
    char* retloc = nullptr;
    auto vld = strtold(ustring.c_str(), &retloc);
    // LCOV_EXCL_START
    if (retloc == nullptr) {
        // to the best of my knowledge this should not happen but this is a
        // weird function sometimes with a lot of platform variations
        *index = 0;
        return constants::invalid_conversion;
    }
    // LCOV_EXCL_STOP
    *index = (retloc - ustring.c_str());
    // so if it converted anything then we can probably use that value if not
    // return NaN
    if (*index == 0) {
        return constants::invalid_conversion;
    }

    if (vld > static_cast<long double>(std::numeric_limits<double>::max())) {
        return constants::infinity;
    }
    if (vld < static_cast<long double>(-std::numeric_limits<double>::max())) {
        return -constants::infinity;
    }
    // floating point min gives you the smallest representable positive value
    if (std::fabs(vld) <
        static_cast<long double>(std::numeric_limits<double>::min())) {
        return 0.0;
    }
    return static_cast<double>(vld);
}